

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmakeevaluator.cpp
# Opt level: O3

ProStringList * __thiscall QMakeEvaluator::valuesRef(QMakeEvaluator *this,ProKey *variableName)

{
  ulong uVar1;
  iterator iVar2;
  ulong uVar3;
  const_iterator cVar4;
  _List_node_base *p_Var5;
  ProStringList *pPVar6;
  char16_t *pcVar7;
  _Base_ptr p_Var8;
  ulong uVar9;
  QArrayDataPointer<ProString> *this_00;
  _List_node_base *p_Var10;
  
  iVar2 = QMap<ProKey,_ProStringList>::find
                    ((QMap<ProKey,_ProStringList> *)
                     ((this->m_valuemapStack).
                      super_list<QMap<ProKey,_ProStringList>,_std::allocator<QMap<ProKey,_ProStringList>_>_>
                      .
                      super__List_base<QMap<ProKey,_ProStringList>,_std::allocator<QMap<ProKey,_ProStringList>_>_>
                      ._M_impl._M_node.super__List_node_base._M_prev + 1),variableName);
  p_Var10 = (this->m_valuemapStack).
            super_list<QMap<ProKey,_ProStringList>,_std::allocator<QMap<ProKey,_ProStringList>_>_>.
            super__List_base<QMap<ProKey,_ProStringList>,_std::allocator<QMap<ProKey,_ProStringList>_>_>
            ._M_impl._M_node.super__List_node_base._M_prev;
  QMap<ProKey,_ProStringList>::detach((QMap<ProKey,_ProStringList> *)(p_Var10 + 1));
  if (iVar2.i._M_node == (_Base_ptr)(p_Var10[1]._M_next + 1)) {
    uVar3 = (ulong)(variableName->super_ProString).m_length;
    pcVar7 = (variableName->super_ProString).m_string.d.ptr;
    if (pcVar7 == (char16_t *)0x0) {
      pcVar7 = (char16_t *)&QString::_empty;
    }
    if ((long)uVar3 < 1) {
LAB_00281b7a:
      pPVar6 = QMap<ProKey,_ProStringList>::operator[]
                         ((QMap<ProKey,_ProStringList> *)
                          ((this->m_valuemapStack).
                           super_list<QMap<ProKey,_ProStringList>,_std::allocator<QMap<ProKey,_ProStringList>_>_>
                           .
                           super__List_base<QMap<ProKey,_ProStringList>,_std::allocator<QMap<ProKey,_ProStringList>_>_>
                           ._M_impl._M_node.super__List_node_base._M_prev + 1),variableName);
      return pPVar6;
    }
    if ((ushort)(pcVar7[(variableName->super_ProString).m_offset] + L'￐') < 10) {
      uVar1 = 1;
      do {
        uVar9 = uVar1;
        if (uVar3 == uVar9) break;
        uVar1 = uVar9 + 1;
      } while ((ushort)((pcVar7 + (variableName->super_ProString).m_offset)[uVar9] + L'￐') < 10);
      if (uVar3 <= uVar9) goto LAB_00281b7a;
    }
    p_Var10 = (this->m_valuemapStack).
              super_list<QMap<ProKey,_ProStringList>,_std::allocator<QMap<ProKey,_ProStringList>_>_>
              .
              super__List_base<QMap<ProKey,_ProStringList>,_std::allocator<QMap<ProKey,_ProStringList>_>_>
              ._M_impl._M_node.super__List_node_base._M_prev;
    do {
      if (p_Var10 ==
          (this->m_valuemapStack).
          super_list<QMap<ProKey,_ProStringList>,_std::allocator<QMap<ProKey,_ProStringList>_>_>.
          super__List_base<QMap<ProKey,_ProStringList>,_std::allocator<QMap<ProKey,_ProStringList>_>_>
          ._M_impl._M_node.super__List_node_base._M_next) goto LAB_00281b7a;
      p_Var10 = p_Var10->_M_prev;
      if (p_Var10[1]._M_next == (_List_node_base *)0x0) {
        p_Var5 = (_List_node_base *)0x0;
        cVar4._M_node = (_Base_ptr)0x0;
      }
      else {
        cVar4 = std::
                _Rb_tree<ProKey,_std::pair<const_ProKey,_ProStringList>,_std::_Select1st<std::pair<const_ProKey,_ProStringList>_>,_std::less<ProKey>,_std::allocator<std::pair<const_ProKey,_ProStringList>_>_>
                ::find((_Rb_tree<ProKey,_std::pair<const_ProKey,_ProStringList>,_std::_Select1st<std::pair<const_ProKey,_ProStringList>_>,_std::less<ProKey>,_std::allocator<std::pair<const_ProKey,_ProStringList>_>_>
                        *)&(p_Var10[1]._M_next)->_M_prev,variableName);
        p_Var5 = p_Var10[1]._M_next;
      }
      p_Var8 = (_Base_ptr)(p_Var5 + 1);
      if (p_Var5 == (_List_node_base *)0x0) {
        p_Var8 = (_Base_ptr)0x0;
      }
    } while (cVar4._M_node == p_Var8);
    this_00 = (QArrayDataPointer<ProString> *)
              QMap<ProKey,_ProStringList>::operator[]
                        ((QMap<ProKey,_ProStringList> *)
                         ((this->m_valuemapStack).
                          super_list<QMap<ProKey,_ProStringList>,_std::allocator<QMap<ProKey,_ProStringList>_>_>
                          .
                          super__List_base<QMap<ProKey,_ProStringList>,_std::allocator<QMap<ProKey,_ProStringList>_>_>
                          ._M_impl._M_node.super__List_node_base._M_prev + 1),variableName);
    if (cVar4._M_node[2]._M_right != (_Base_ptr)QMakeInternal::statics._608_8_) {
      QArrayDataPointer<ProString>::operator=
                (this_00,(QArrayDataPointer<ProString> *)&cVar4._M_node[2]._M_left);
    }
  }
  else {
    this_00 = (QArrayDataPointer<ProString> *)((long)iVar2.i._M_node + 0x50);
    if (*(long *)((long)iVar2.i._M_node + 0x58) == QMakeInternal::statics._608_8_) {
      QList<ProString>::clear((QList<ProString> *)this_00);
    }
  }
  return (ProStringList *)this_00;
}

Assistant:

ProStringList &QMakeEvaluator::valuesRef(const ProKey &variableName)
{
    ProValueMap::Iterator it = m_valuemapStack.top().find(variableName);
    if (it != m_valuemapStack.top().end()) {
        if (it->constBegin() == statics.fakeValue.constBegin())
            it->clear();
        return *it;
    }
    if (!isFunctParam(variableName)) {
        ProValueMapStack::iterator vmi = m_valuemapStack.end();
        if (--vmi != m_valuemapStack.begin()) {
            do {
                --vmi;
                ProValueMap::ConstIterator it = (*vmi).constFind(variableName);
                if (it != (*vmi).constEnd()) {
                    ProStringList &ret = m_valuemapStack.top()[variableName];
                    if (it->constBegin() != statics.fakeValue.constBegin())
                        ret = *it;
                    return ret;
                }
            } while (vmi != m_valuemapStack.begin());
        }
    }
    return m_valuemapStack.top()[variableName];
}